

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O0

bool __thiscall GF2::WW<127UL>::IsAll(WW<127UL> *this,bool val)

{
  ulong uVar1;
  size_t pos;
  word w;
  bool val_local;
  WW<127UL> *this_local;
  
  uVar1 = 0;
  if (val) {
    uVar1 = 0xffffffffffffffff;
  }
  pos = 0;
  while( true ) {
    if (1 < pos + 1) {
      return this->_words[pos] == (uVar1 & 0x7fffffffffffffff);
    }
    if (this->_words[pos] != uVar1) break;
    pos = pos + 1;
  }
  return false;
}

Assistant:

bool IsAll(bool val) const
	{
		// проверить все слова представления, кроме последнего
		word w = val ? WORD_MAX : 0;
		size_t pos = 0;
        for (; pos + 1 < _wcount; pos++)
			if (_words[pos] != w) 
				return false;
		// проверить последнее слово представления
		return _words[pos] == (w << _tcount >> _tcount);
	}